

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O1

void pdf_drop_obj(hd_context *ctx,pdf_obj *obj)

{
  short sVar1;
  long lVar2;
  long lVar3;
  
  if (((obj < (pdf_obj *)0x189) || (obj->refs < 1)) ||
     (sVar1 = obj->refs + -1, obj->refs = sVar1, sVar1 != 0)) {
    return;
  }
  if (obj->kind == 'a') {
    if (0 < (int)obj[5]) {
      lVar2 = 0;
      do {
        pdf_drop_obj(ctx,*(pdf_obj **)(*(long *)(obj + 8) + lVar2 * 8));
        lVar2 = lVar2 + 1;
      } while (lVar2 < (int)obj[5]);
    }
  }
  else {
    if (obj->kind != 'd') goto LAB_0010c5c5;
    if (0 < (int)obj[5]) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        pdf_drop_obj(ctx,*(pdf_obj **)(*(long *)(obj + 8) + lVar3));
        pdf_drop_obj(ctx,*(pdf_obj **)(*(long *)(obj + 8) + 8 + lVar3));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < (int)obj[5]);
    }
  }
  hd_free(ctx,*(void **)(obj + 8));
LAB_0010c5c5:
  hd_free(ctx,obj);
  return;
}

Assistant:

void
pdf_drop_obj(hd_context *ctx, pdf_obj *obj)
{
    if (obj >= PDF_OBJ__LIMIT)
    {
        if (hd_drop_imp16(ctx, obj, &obj->refs))
        {
            if (obj->kind == PDF_ARRAY)
                pdf_drop_array(ctx, obj);
            else if (obj->kind == PDF_DICT)
                pdf_drop_dict(ctx, obj);
            else
                hd_free(ctx, obj);
        }
    }
}